

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int jsonEachNext(sqlite3_vtab_cursor *cur)

{
  JsonParse *pParse;
  char **ppcVar1;
  int iVar2;
  uint uVar3;
  u32 uVar4;
  u32 uVar5;
  int iVar6;
  ulong in_RAX;
  sqlite3_vtab *psVar7;
  byte bVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  u32 sz;
  u32 sz_1;
  
  pParse = (JsonParse *)(cur + 0x18);
  if (*(char *)((long)&cur[3].pVtab + 1) == '\0') {
    _sz = in_RAX & 0xffffffff;
    uVar4 = jsonSkipLabel((JsonEachCursor *)cur);
    uVar5 = jsonbPayloadSize(pParse,uVar4,&sz_1);
    *(u32 *)((long)&cur[1].pVtab + 4) = uVar5 + uVar4 + sz_1;
    iVar6 = 0;
  }
  else {
    _sz = in_RAX & 0xffffffff00000000;
    uVar3 = jsonSkipLabel((JsonEachCursor *)cur);
    bVar8 = *(byte *)((long)&(cur[0x18].pVtab)->pModule + (ulong)uVar3);
    uVar4 = jsonbPayloadSize(pParse,uVar3,&sz);
    bVar12 = (byte)((bVar8 & 0xf) - 0xd) < 0xfe;
    if (bVar12) {
      uVar3 = uVar4 + uVar3 + sz;
      *(uint *)((long)&cur[1].pVtab + 4) = uVar3;
      uVar9 = *(uint *)((long)&cur[3].pVtab + 4);
      iVar6 = 0;
    }
    else {
      uVar9 = *(uint *)((long)&cur[3].pVtab + 4);
      if (uVar9 < *(uint *)&cur[4].pVtab) {
        psVar7 = cur[5].pVtab;
      }
      else {
        uVar9 = *(uint *)&cur[4].pVtab * 2 + 3;
        psVar7 = (sqlite3_vtab *)
                 sqlite3DbRealloc((sqlite3 *)cur[6].pVtab,cur[5].pVtab,(ulong)uVar9 * 0x18);
        if (psVar7 == (sqlite3_vtab *)0x0) {
          return 7;
        }
        *(uint *)&cur[4].pVtab = uVar9;
        cur[5].pVtab = psVar7;
        uVar9 = *(uint *)((long)&cur[3].pVtab + 4);
      }
      *(undefined4 *)&psVar7[uVar9].pModule = *(undefined4 *)((long)&cur[1].pVtab + 4);
      *(uint *)((long)&psVar7[uVar9].pModule + 4) = uVar3;
      uVar3 = uVar4 + uVar3;
      psVar7[uVar9].nRef = sz + uVar3;
      psVar7[uVar9].zErrMsg = (char *)0xffffffffffffffff;
      *(undefined4 *)&psVar7[uVar9].field_0xc = *(undefined4 *)&cur[10].pVtab;
      iVar6 = 0;
      if ((uVar9 != 0) && (*(char *)&cur[3].pVtab != '\0')) {
        jsonAppendPathName((JsonEachCursor *)cur);
        iVar6 = 7;
        if (*(char *)((long)&cur[0xb].pVtab + 1) == '\0') {
          iVar6 = 0;
        }
        uVar9 = *(uint *)((long)&cur[3].pVtab + 4);
      }
      uVar9 = uVar9 + 1;
      *(uint *)((long)&cur[3].pVtab + 4) = uVar9;
      *(uint *)((long)&cur[1].pVtab + 4) = uVar3;
    }
    uVar10 = (ulong)uVar9;
    while (uVar10 != 0) {
      psVar7 = cur[5].pVtab;
      uVar10 = uVar10 - 1;
      uVar11 = uVar10 & 0xffffffff;
      if (uVar3 < (uint)psVar7[uVar11].nRef) {
        if (bVar12) goto LAB_001987c1;
        bVar8 = pParse->aBlob[*(uint *)((long)&psVar7[uVar11].pModule + 4)] & 0xf;
        goto LAB_001987be;
      }
      *(int *)((long)&cur[3].pVtab + 4) = (int)uVar10;
      cur[10].pVtab = (sqlite3_vtab *)(ulong)*(uint *)&psVar7[uVar11].field_0xc;
      bVar12 = false;
    }
    if (!bVar12) {
      bVar8 = 0;
LAB_001987be:
      *(byte *)&cur[3].pVtab = bVar8;
    }
  }
LAB_001987c1:
  if ((*(char *)&cur[3].pVtab == '\v') && (iVar2 = *(int *)((long)&cur[3].pVtab + 4), iVar2 != 0)) {
    ppcVar1 = &cur[5].pVtab[iVar2 - 1].zErrMsg;
    *ppcVar1 = *ppcVar1 + 1;
  }
  *(int *)&cur[1].pVtab = *(int *)&cur[1].pVtab + 1;
  return iVar6;
}

Assistant:

static int jsonEachNext(sqlite3_vtab_cursor *cur){
  JsonEachCursor *p = (JsonEachCursor*)cur;
  int rc = SQLITE_OK;
  if( p->bRecursive ){
    u8 x;
    u8 levelChange = 0;
    u32 n, sz = 0;
    u32 i = jsonSkipLabel(p);
    x = p->sParse.aBlob[i] & 0x0f;
    n = jsonbPayloadSize(&p->sParse, i, &sz);
    if( x==JSONB_OBJECT || x==JSONB_ARRAY ){
      JsonParent *pParent;
      if( p->nParent>=p->nParentAlloc ){
        JsonParent *pNew;
        u64 nNew;
        nNew = p->nParentAlloc*2 + 3;
        pNew = sqlite3DbRealloc(p->db, p->aParent, sizeof(JsonParent)*nNew);
        if( pNew==0 ) return SQLITE_NOMEM;
        p->nParentAlloc = (u32)nNew;
        p->aParent = pNew;
      }
      levelChange = 1;
      pParent = &p->aParent[p->nParent];
      pParent->iHead = p->i;
      pParent->iValue = i;
      pParent->iEnd = i + n + sz;
      pParent->iKey = -1;
      pParent->nPath = (u32)p->path.nUsed;
      if( p->eType && p->nParent ){
        jsonAppendPathName(p);
        if( p->path.eErr ) rc = SQLITE_NOMEM;
      }
      p->nParent++;
      p->i = i + n;
    }else{
      p->i = i + n + sz;
    }
    while( p->nParent>0 && p->i >= p->aParent[p->nParent-1].iEnd ){
      p->nParent--;
      p->path.nUsed = p->aParent[p->nParent].nPath;
      levelChange = 1;
    }
    if( levelChange ){
      if( p->nParent>0 ){
        JsonParent *pParent = &p->aParent[p->nParent-1];
        u32 iVal = pParent->iValue;
        p->eType = p->sParse.aBlob[iVal] & 0x0f;
      }else{
        p->eType = 0;
      }
    }
  }else{
    u32 n, sz = 0;
    u32 i = jsonSkipLabel(p);
    n = jsonbPayloadSize(&p->sParse, i, &sz);
    p->i = i + n + sz;
  }
  if( p->eType==JSONB_ARRAY && p->nParent ){
    p->aParent[p->nParent-1].iKey++;
  }
  p->iRowid++;
  return rc;
}